

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosYAML.cpp
# Opt level: O3

void adios2::helper::anon_unknown_0::SetOption<bool>
               (bool *value,string nodeName,Node *upperNode,string *hint,bool mandatory)

{
  bool bVar1;
  undefined7 in_register_00000009;
  string *in_R8;
  Node node;
  string local_98;
  as_if<bool,_void> local_78;
  Node local_70;
  
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_98,upperNode,&upperNode->m_isValid + (long)&hint->_M_dataplus);
  YAMLNode(&local_70,&local_98,(Node *)CONCAT71(in_register_00000009,mandatory),in_R8,false,Scalar);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  if ((local_70.m_isValid == true) &&
     ((local_70.m_pNode == (node *)0x0 ||
      ((((((local_70.m_pNode)->m_pRef).
          super___shared_ptr<YAML::detail::node_ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->m_pData).
        super___shared_ptr<YAML::detail::node_data,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->m_isDefined
       == true)))) {
    local_78.node = &local_70;
    bVar1 = YAML::as_if<bool,_void>::operator()(&local_78);
    *value = bVar1;
  }
  if (local_70.m_pMemory.super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_70.m_pMemory.
               super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.m_invalidKey._M_dataplus._M_p != &local_70.m_invalidKey.field_2) {
    operator_delete(local_70.m_invalidKey._M_dataplus._M_p);
  }
  return;
}

Assistant:

void SetOption(T &value, const std::string nodeName, const YAML::Node &upperNode,
               const std::string &hint, bool mandatory = isNotMandatory)
{
    auto node = YAMLNode(nodeName, upperNode, hint, mandatory, YAML::NodeType::Scalar);
    if (node)
    {
        value = node.as<T>();
    }
}